

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar11;
  byte bVar12;
  uint16_t uVar13;
  ulong uVar14;
  ushort uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  byte *pbVar20;
  byte *pbVar21;
  ulong uVar22;
  double dVar23;
  Number NVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  pbVar3 = (byte *)is->src_;
  bVar2 = *pbVar3;
  pbVar21 = pbVar3;
  bVar12 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar21 = pbVar3 + 1;
    bVar12 = pbVar3[1];
  }
  pCVar4 = is->head_;
  if (bVar12 == 0x30) {
    uVar17 = (uint)pbVar21[1];
    pbVar20 = pbVar21 + 1;
    dVar23 = 0.0;
    bVar7 = false;
    uVar22 = 0;
    bVar6 = false;
    iVar8 = 0;
    bVar5 = false;
    uVar19 = 0;
    goto LAB_00107d2e;
  }
  if ((byte)(bVar12 - 0x31) < 9) {
    uVar19 = bVar12 - 0x30;
    bVar12 = pbVar21[1];
    uVar14 = (ulong)bVar12;
    pbVar20 = pbVar21 + 1;
    dVar23 = 0.0;
    if (bVar2 == 0x2d) {
      if ((byte)(bVar12 - 0x30) < 10) {
        iVar8 = 0;
LAB_00107b9a:
        if (uVar19 < 0xccccccc) {
LAB_00107ba3:
          uVar19 = (uVar19 * 10 + (int)uVar14) - 0x30;
          iVar8 = iVar8 + 1;
          bVar12 = pbVar20[1];
          uVar14 = (ulong)bVar12;
          pbVar20 = pbVar20 + 1;
          if (9 < (byte)(bVar12 - 0x30)) goto LAB_00107c7c;
          goto LAB_00107b9a;
        }
        if (uVar19 != 0xccccccc) goto LAB_00107c1d;
        if ((byte)uVar14 < 0x39) goto LAB_00107ba3;
        uVar19 = 0xccccccc;
        uVar14 = 0x39;
LAB_00107c1d:
        uVar22 = (ulong)uVar19;
        if (bVar2 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar22) && (0x38 < (byte)uVar14 || uVar22 != 0xccccccccccccccc)
               ) goto LAB_00107ccc;
            uVar22 = (uVar14 & 0xf) + uVar22 * 10;
            iVar8 = iVar8 + 1;
            bVar12 = pbVar20[1];
            uVar14 = (ulong)bVar12;
            pbVar20 = pbVar20 + 1;
          } while ((byte)(bVar12 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar22) &&
               (0x35 < (byte)uVar14 || uVar22 != 0x1999999999999999)) goto LAB_00107ccc;
            uVar22 = (uVar14 & 0xf) + uVar22 * 10;
            iVar8 = iVar8 + 1;
            bVar12 = pbVar20[1];
            uVar14 = (ulong)bVar12;
            pbVar20 = pbVar20 + 1;
          } while ((byte)(bVar12 - 0x30) < 10);
        }
        uVar17 = (uint)bVar12;
        dVar23 = 0.0;
        bVar5 = true;
        bVar7 = false;
        bVar6 = false;
        goto LAB_00107d2e;
      }
LAB_0010820f:
      iVar8 = 0;
    }
    else {
      if (9 < (byte)(bVar12 - 0x30)) goto LAB_0010820f;
      iVar8 = 0;
      do {
        if (0x19999998 < uVar19) {
          if (uVar19 != 0x19999999) goto LAB_00107c1d;
          if (0x35 < (byte)uVar14) {
            uVar19 = 0x19999999;
            goto LAB_00107c1d;
          }
        }
        uVar19 = (uVar19 * 10 + (int)uVar14) - 0x30;
        iVar8 = iVar8 + 1;
        bVar12 = pbVar20[1];
        uVar14 = (ulong)bVar12;
        pbVar20 = pbVar20 + 1;
      } while ((byte)(bVar12 - 0x30) < 10);
    }
LAB_00107c7c:
    uVar17 = (uint)bVar12;
    bVar7 = false;
    uVar22 = 0;
    bVar6 = false;
    bVar5 = false;
    goto LAB_00107d2e;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                  ,0x60c,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar10 = (long)pbVar21 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_00107f91;
LAB_00107f58:
  do {
    pbVar21 = pbVar20 + 1;
    pbVar20 = pbVar20 + 1;
  } while ((byte)(*pbVar21 - 0x30) < 10);
LAB_00108006:
  iVar8 = -iVar18;
  if (!bVar7) {
    iVar8 = iVar18;
  }
LAB_00108013:
  if (bVar6) {
LAB_00108018:
    uVar17 = iVar8 + iVar16;
    if ((int)uVar17 < -0x134) {
      NVar24.i64 = 0;
      if (0xfffffd97 < uVar17) {
        NVar24.d = (dVar23 / 1e+308) /
                   *(double *)(internal::Pow10(int)::e + (ulong)(-uVar17 - 0x134) * 8);
        goto LAB_0010818f;
      }
    }
    else {
      if ((int)uVar17 < 0) {
        NVar24.d = dVar23 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar17 * 8);
      }
      else {
        if (0x134 < uVar17) {
          __assert_fail("n >= 0 && n <= 308",
                        "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/internal/pow10.h"
                        ,0x30,"double rapidjson::internal::Pow10(int)");
        }
        NVar24.d = dVar23 * *(double *)(internal::Pow10(int)::e + (ulong)uVar17 * 8);
      }
LAB_0010818f:
      if (1.79769313486232e+308 < NVar24.d) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                        ,0x6bb,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        goto LAB_001081b3;
      }
    }
    pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    if (bVar2 == 0x2d) {
      NVar24.u64 = NVar24.u64 ^ 0x8000000000000000;
    }
    (pGVar11->data_).s.str = (Ch *)0x216000000000000;
    (pGVar11->data_).n = NVar24;
    pbVar21 = pbVar20;
  }
  else {
    pbVar21 = pbVar20;
    if (!bVar5) {
      if (bVar2 == 0x2d) {
        pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar11->data_).s.str = (Ch *)0x0;
        *(long *)&pGVar11->data_ = (long)(int)-uVar19;
        uVar13 = 0xb6;
        if ((int)uVar19 < 1) {
          uVar13 = 0x1f6;
        }
        (pGVar11->data_).f.flags = uVar13;
      }
      else {
        pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar11->data_).s.str = (Ch *)0x0;
        *(ulong *)&pGVar11->data_ = uVar14;
        (pGVar11->data_).f.flags = (ushort)(-1 < (int)uVar19) << 5 | 0x1d6;
      }
      goto LAB_001081f4;
    }
    if (bVar2 != 0x2d) {
      pGVar11 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar11->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar11->data_ = uVar22;
      uVar15 = (ushort)((uVar22 & 0xffffffff80000000) == 0) << 5 | 0x1d6;
      if (uVar22 >> 0x20 != 0) {
        uVar15 = (ushort)(-1 < (long)uVar22) << 7 | 0x116;
      }
      (pGVar11->data_).f.flags = uVar15;
      goto LAB_001081f4;
    }
    bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int64(handler,-uVar22);
    if (bVar7) goto LAB_001081f4;
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                    ,0x6d3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_001081b3:
    *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
    pbVar21 = pbVar20;
  }
  goto LAB_001081f4;
LAB_00107ccc:
  auVar25._8_4_ = (int)(uVar22 >> 0x20);
  auVar25._0_8_ = uVar22;
  auVar25._12_4_ = 0x45300000;
  dVar23 = (auVar25._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar22) - 4503599627370496.0);
  do {
    dVar23 = dVar23 * 10.0 + (double)((int)uVar14 + -0x30);
    bVar12 = pbVar20[1];
    uVar14 = (ulong)bVar12;
    uVar17 = (uint)bVar12;
    pbVar20 = pbVar20 + 1;
  } while ((byte)(bVar12 - 0x30) < 10);
  bVar7 = true;
  bVar6 = true;
  bVar5 = true;
LAB_00107d2e:
  uVar14 = (ulong)uVar19;
  if ((char)uVar17 == '.') {
    uVar17 = (uint)pbVar20[1];
    pbVar21 = pbVar20 + 1;
    if ((byte)(pbVar20[1] - 0x3a) < 0xf6) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                      ,0x637,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xe;
      *(long *)(this + 0x38) = (long)pbVar21 - (long)pCVar4;
      goto LAB_001081f4;
    }
    iVar16 = 0;
    if (bVar7) {
LAB_00107de0:
      do {
        pbVar20 = pbVar21;
        if (0x39 < (byte)uVar17) goto LAB_00107e8b;
        if (iVar8 < 0x11) {
          dVar23 = dVar23 * 10.0 + (double)(int)(uVar17 - 0x30);
          iVar16 = iVar16 + -1;
          if (0.0 < dVar23) {
            iVar8 = iVar8 + 1;
          }
        }
        pbVar1 = pbVar21 + 1;
        uVar17 = (uint)*pbVar1;
        pbVar20 = pbVar21 + 1;
        pbVar21 = pbVar20;
      } while ('/' < (char)*pbVar1);
      iVar8 = 0;
      goto LAB_00108013;
    }
    if (!bVar5) {
      uVar22 = uVar14;
    }
    iVar16 = 0;
    do {
      if ((0x39 < (byte)uVar17) || (uVar22 >> 0x35 != 0)) {
        auVar26._8_4_ = (int)(uVar22 >> 0x20);
        auVar26._0_8_ = uVar22;
        auVar26._12_4_ = 0x45300000;
        dVar23 = (auVar26._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar22) - 4503599627370496.0);
        bVar6 = true;
        goto LAB_00107de0;
      }
      pbVar20 = pbVar21 + 1;
      iVar16 = iVar16 + -1;
      uVar22 = (ulong)(uVar17 - 0x30) + uVar22 * 10;
      iVar8 = iVar8 + (uint)(uVar22 != 0);
      pbVar1 = pbVar21 + 1;
      uVar17 = (uint)*pbVar1;
      pbVar21 = pbVar20;
    } while ('/' < (char)*pbVar1);
    dVar23 = (double)(long)uVar22;
    iVar8 = 0;
    goto LAB_00108018;
  }
  iVar16 = 0;
LAB_00107e8b:
  iVar8 = 0;
  if ((uVar17 | 0x20) != 0x65) goto LAB_00108013;
  uVar9 = uVar14;
  if (bVar5) {
    uVar9 = uVar22;
  }
  if (!bVar6) {
    auVar27._8_4_ = (int)(uVar9 >> 0x20);
    auVar27._0_8_ = uVar9;
    auVar27._12_4_ = 0x45300000;
    dVar23 = (auVar27._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
    bVar6 = true;
  }
  bVar12 = pbVar20[1];
  bVar7 = bVar12 != 0x2b;
  if ((bVar7) && (bVar12 != 0x2d)) {
    if ((byte)(bVar12 - 0x30) < 10) {
      pbVar20 = pbVar20 + 2;
      iVar18 = bVar12 - 0x30;
LAB_00107fb9:
      do {
        bVar12 = *pbVar20;
        if (9 < (byte)(bVar12 - 0x30)) {
          bVar7 = false;
          goto LAB_00108006;
        }
        pbVar20 = pbVar20 + 1;
        iVar18 = iVar18 * 10 + (uint)bVar12 + -0x30;
      } while (iVar18 <= 0x134 - iVar16);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                      ,0x687,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
      pbVar21 = pbVar20;
      goto LAB_001081f4;
    }
    pbVar21 = pbVar20 + 1;
  }
  else {
    pbVar21 = pbVar20 + 2;
    if ((byte)(*pbVar21 - 0x30) < 10) {
      pbVar20 = pbVar20 + 3;
      iVar18 = *pbVar21 - 0x30;
      if (bVar12 != 0x2b) {
        if (0 < iVar16) {
          __assert_fail("expFrac <= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                        ,0x677,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        bVar12 = *pbVar20;
        if ((byte)(bVar12 - 0x30) < 10) {
          do {
            iVar18 = iVar18 * 10 + (uint)bVar12 + -0x30;
            if ((iVar16 + 0x7ffffff7) / 10 < iVar18) goto LAB_00107f58;
            pbVar20 = pbVar20 + 1;
            bVar12 = *pbVar20;
          } while ((byte)(bVar12 - 0x30) < 10);
        }
        else {
          bVar7 = true;
        }
        goto LAB_00108006;
      }
      goto LAB_00107fb9;
    }
    pbVar21 = pbVar20 + 2;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                  ,0x68c,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar10 = (long)pbVar21 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 0xf;
LAB_00107f91:
  *(long *)(this + 0x38) = lVar10;
LAB_001081f4:
  is->src_ = (Ch *)pbVar21;
  is->head_ = pCVar4;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        typedef typename internal::SelectIf<internal::BoolType<(parseFlags & kParseNumbersAsStringsFlag) != 0>, typename TargetEncoding::Ch, char>::Type NumberCharacter;

        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream, NumberCharacter,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                GenericStringStream<UTF8<NumberCharacter> > srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<typename TargetEncoding::Ch>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const NumberCharacter* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }